

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_OFFReader_::read_ascii
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  ostream *poVar5;
  _OFFReader_ *p_Var6;
  uint uVar7;
  stringstream local_2d8 [8];
  stringstream stream;
  size_type *local_150;
  string header;
  undefined1 local_128 [4];
  uint dummy;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  string line;
  VHandles vhandles;
  undefined4 local_c8;
  uint k;
  uint l;
  uint idx;
  string trash;
  undefined1 local_98 [8];
  Vec4f c4f;
  undefined1 local_80 [8];
  Vec3f c3f;
  uint nF;
  uint j;
  Vec3i c3;
  Vec4i c4;
  uint nV;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  line.field_2._8_8_ = 0;
  vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_150 = &header._M_string_length;
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  trash.field_2._8_8_ = _opt;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&local_150);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  (*_bi->_vptr_BaseImporter[0x1b])
            (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[3],
             (ulong)(uint)(c4.super_VectorDataT<int,_4>.values_[3] * 3),
             (ulong)(uint)c3f.super_VectorDataT<float,_3>.values_[1]);
  uVar7 = 0;
  while ((uVar7 < (uint)c4.super_VectorDataT<int,_4>.values_[3] &&
         (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) == 0))) {
    std::istream::_M_extract<float>((float *)_in);
    std::istream::_M_extract<float>((float *)_in);
    std::istream::_M_extract<float>((float *)_in);
    uVar1 = (*_bi->_vptr_BaseImporter[2])(_bi,local_128);
    if (((this->options_).flags_ & 0x10) != 0) {
      std::istream::_M_extract<float>((float *)_in);
      std::istream::_M_extract<float>((float *)_in);
      std::istream::_M_extract<float>((float *)_in);
      if (((this->userOptions_).flags_ & 0x10) != 0) {
        (*_bi->_vptr_BaseImporter[8])(_bi,(ulong)uVar1,v.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
    t.super_VectorDataT<float,_2>.values_ = (VectorDataT<float,_2>)&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    p_Var6 = (_OFFReader_ *)_in;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&t);
    iVar2 = getColorType(p_Var6,(string *)&t,SUB41(((this->options_).flags_ & 0x40U) >> 6,0));
    std::__cxx11::stringstream::stringstream(local_2d8,(string *)&t,_S_out|_S_in);
    uVar3 = (this->options_).flags_;
    if ((uVar3 & 0x20) != 0) {
      _l = &trash._M_string_length;
      trash._M_dataplus._M_p = (pointer)0x0;
      trash._M_string_length._0_1_ = 0;
      switch(iVar2) {
      case 0:
        break;
      case 2:
        std::operator>>((istream *)local_2d8,(string *)&l);
      case 1:
        std::operator>>((istream *)local_2d8,(string *)&l);
        break;
      case 3:
        std::istream::operator>>(local_2d8,(int *)&nF);
        std::istream::operator>>(local_2d8,(int *)&j);
        std::istream::operator>>(local_2d8,(int *)&c3);
        if (((this->userOptions_).flags_ & 0x20) != 0) {
          local_34 = (undefined1)nF;
          local_33 = (undefined1)j;
          local_32 = (undefined1)c3.super_VectorDataT<int,_3>.values_[0];
          (*_bi->_vptr_BaseImporter[9])(_bi,(ulong)uVar1,&local_34);
        }
        break;
      case 4:
        std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 1);
        std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 2);
        std::istream::operator>>(local_2d8,(int *)&c4);
        std::istream::operator>>(local_2d8,c4.super_VectorDataT<int,_4>.values_ + 1);
        if (((this->userOptions_).flags_ & 0x20) != 0) {
          local_34 = (undefined1)c3.super_VectorDataT<int,_3>.values_[1];
          local_33 = (undefined1)c3.super_VectorDataT<int,_3>.values_[2];
          local_32 = (undefined1)c4.super_VectorDataT<int,_4>.values_[0];
          local_31 = (undefined1)c4.super_VectorDataT<int,_4>.values_[1];
          (*_bi->_vptr_BaseImporter[10])(_bi,(ulong)uVar1,&local_34);
        }
        break;
      case 5:
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        if (((this->userOptions_).flags_ & 0x20) != 0) {
          (*_bi->_vptr_BaseImporter[0xb])(_bi,(ulong)uVar1,local_80);
LAB_00196f56:
          *(byte *)(trash.field_2._8_8_ + 1) = *(byte *)(trash.field_2._8_8_ + 1) | 0x10;
        }
        break;
      case 6:
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        if (((this->userOptions_).flags_ & 0x20) != 0) {
          (*_bi->_vptr_BaseImporter[0xc])(_bi,(ulong)uVar1,local_98);
          goto LAB_00196f56;
        }
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in file format (colorType = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        std::operator<<(poVar5,")\n");
      }
      std::__cxx11::string::~string((string *)&l);
      uVar3 = (this->options_).flags_;
    }
    if ((uVar3 & 0x40) != 0) {
      std::istream::_M_extract<float>((float *)local_2d8);
      std::istream::_M_extract<float>((float *)local_2d8);
      if (((this->userOptions_).flags_ & 0x40) != 0) {
        (*_bi->_vptr_BaseImporter[0xd])(_bi,(ulong)uVar1,n.super_VectorDataT<float,_3>.values_ + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_2d8);
    std::__cxx11::string::~string((string *)&t);
    uVar7 = uVar7 + 1;
  }
  fVar4 = 0.0;
  this_00 = (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
            ((long)&line.field_2 + 8);
  do {
    if ((uint)c3f.super_VectorDataT<float,_3>.values_[1] <= (uint)fVar4) {
      std::__cxx11::string::~string((string *)&local_150);
      std::_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
      ~_Vector_base((_Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *
                    )((long)&line.field_2 + 8));
      return true;
    }
    std::istream::_M_extract<unsigned_int>((uint *)_in);
    if (c4.super_VectorDataT<int,_4>.values_[3] == 3) {
      std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                (this_00,3);
      std::istream::_M_extract<unsigned_int>((uint *)_in);
      std::istream::_M_extract<unsigned_int>((uint *)_in);
      std::istream::_M_extract<unsigned_int>((uint *)_in);
      *(float *)line.field_2._8_8_ = c3f.super_VectorDataT<float,_3>.values_[2];
      *(undefined4 *)(line.field_2._8_8_ + 4) =
           vhandles.
           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      *(undefined4 *)(line.field_2._8_8_ + 8) = local_c8;
    }
    else {
      if (vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)line.field_2._8_8_) {
        vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)line.field_2._8_8_;
      }
      for (c3f.super_VectorDataT<float,_3>.values_[2] = 0.0;
          (uint)c3f.super_VectorDataT<float,_3>.values_[2] <
          (uint)c4.super_VectorDataT<int,_4>.values_[3];
          c3f.super_VectorDataT<float,_3>.values_[2] =
               (float)((int)c3f.super_VectorDataT<float,_3>.values_[2] + 1)) {
        std::istream::_M_extract<unsigned_int>((uint *)_in);
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
        emplace_back<OpenMesh::VertexHandle>(this_00,(VertexHandle *)local_2d8);
      }
    }
    iVar2 = (*_bi->_vptr_BaseImporter[4])(_bi,this_00);
    if (((this->options_).flags_ & 0x200) != 0) {
      t.super_VectorDataT<float,_2>.values_ = (VectorDataT<float,_2>)&line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      p_Var6 = (_OFFReader_ *)_in;
      c4.super_VectorDataT<int,_4>.values_[2] = iVar2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&t);
      iVar2 = getColorType(p_Var6,(string *)&t,false);
      std::__cxx11::stringstream::stringstream(local_2d8,(string *)&t,_S_out|_S_in);
      _l = &trash._M_string_length;
      trash._M_dataplus._M_p = (pointer)0x0;
      trash._M_string_length._0_1_ = 0;
      switch(iVar2) {
      case 0:
        break;
      case 2:
        std::operator>>((istream *)local_2d8,(string *)&l);
      case 1:
        std::operator>>((istream *)local_2d8,(string *)&l);
        break;
      case 3:
        std::istream::operator>>(local_2d8,(int *)&nF);
        std::istream::operator>>(local_2d8,(int *)&j);
        std::istream::operator>>(local_2d8,(int *)&c3);
        if (((this->userOptions_).flags_ & 0x200) != 0) {
          local_34 = (undefined1)nF;
          local_33 = (undefined1)j;
          local_32 = (undefined1)c3.super_VectorDataT<int,_3>.values_[0];
          (*_bi->_vptr_BaseImporter[0x14])
                    (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[2],&local_34);
        }
        break;
      case 4:
        std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 1);
        std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 2);
        std::istream::operator>>(local_2d8,(int *)&c4);
        std::istream::operator>>(local_2d8,c4.super_VectorDataT<int,_4>.values_ + 1);
        if (((this->userOptions_).flags_ & 0x200) != 0) {
          local_34 = (undefined1)c3.super_VectorDataT<int,_3>.values_[1];
          local_33 = (undefined1)c3.super_VectorDataT<int,_3>.values_[2];
          local_32 = (undefined1)c4.super_VectorDataT<int,_4>.values_[0];
          local_31 = (undefined1)c4.super_VectorDataT<int,_4>.values_[1];
          (*_bi->_vptr_BaseImporter[0x15])
                    (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[2],&local_34);
        }
        break;
      case 5:
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        if (((this->userOptions_).flags_ & 0x200) != 0) {
          (*_bi->_vptr_BaseImporter[0x16])
                    (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[2],local_80);
LAB_0019731f:
          *(byte *)(trash.field_2._8_8_ + 1) = *(byte *)(trash.field_2._8_8_ + 1) | 0x10;
        }
        break;
      case 6:
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        if (((this->userOptions_).flags_ & 0x200) != 0) {
          (*_bi->_vptr_BaseImporter[0x17])
                    (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[2],local_98);
          goto LAB_0019731f;
        }
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in file format (colorType = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        std::operator<<(poVar5,")\n");
      }
      std::__cxx11::string::~string((string *)&l);
      std::__cxx11::stringstream::~stringstream(local_2d8);
      std::__cxx11::string::~string((string *)&t);
    }
    fVar4 = (float)((int)fVar4 + 1);
  } while( true );
}

Assistant:

bool
_OFFReader_::read_ascii(std::istream& _in, BaseImporter& _bi, Options& _opt) const
{


  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec2f         t;
  OpenMesh::Vec3i         c3;
  OpenMesh::Vec3f         c3f;
  OpenMesh::Vec4i         c4;
  OpenMesh::Vec4f         c4f;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  _in >> nV;
  _in >> nF;
  _in >> dummy;

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read VERTEX
    _in >> v[0]; _in >> v[1]; _in >> v[2];

    vh = _bi.add_vertex(v);

    //perhaps read NORMAL
    if ( options_.vertex_has_normal() ){

      _in >> n[0]; _in >> n[1]; _in >> n[2];

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    //take the rest of the line and check how colors are defined
    std::string line;
    std::getline(_in,line);

    int colorType = getColorType(line, options_.vertex_has_texcoord() );

    std::stringstream stream( line );

    //perhaps read COLOR
    if ( options_.vertex_has_color() ){

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
    //perhaps read TEXTURE COORDs
    if ( options_.vertex_has_texcoord() ){
      stream >> t[0]; stream >> t[1];
      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  for (i=0; i<nF; ++i)
  {
    // nV = number of Vertices for current face
    _in >> nV;

    if (nV == 3)
    {
      vhandles.resize(3);
      _in >> j;
      _in >> k;
      _in >> l;

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    }
    else
    {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         _in >> idx;
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //perhaps read face COLOR
    if ( options_.face_has_color() ){

      //take the rest of the line and check how colors are defined
      std::string line;
      std::getline(_in,line);

      int colorType = getColorType(line, false );

      std::stringstream stream( line );

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
  }

  // File was successfully parsed.
  return true;
}